

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadFunctions.cpp
# Opt level: O3

void __thiscall
Producer::operator()(Producer *this,Queue<int> *q,TimeT startTime,TimeT period,int noMessages)

{
  _Storage<int,_true> _Var1;
  iterator __position;
  bool bVar2;
  _Optional_payload_base<int> _Var3;
  long lVar4;
  int iVar5;
  int *piVar6;
  _Storage<int,_true> local_4c;
  undefined1 local_48 [8];
  long local_40;
  Queue<int> *local_38;
  
  local_38 = q;
  std::chrono::_V2::system_clock::now();
  std::vector<int,_std::allocator<int>_>::reserve(&this->producedValues,200);
  if (0 < startTime.__r) {
    local_48 = (undefined1  [8])((ulong)startTime.__r / 1000);
    local_40 = ((ulong)startTime.__r % 1000) * 1000000;
    do {
      iVar5 = nanosleep((timespec *)local_48,(timespec *)local_48);
      if (iVar5 != -1) break;
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
  }
  local_4c._M_value = 1;
  if (0 < noMessages) {
    do {
      local_48[4] = true;
      local_48._0_4_ = local_4c._M_value;
      rtb::Concurrency::Queue<int>::push(local_38,(optional<int> *)local_48);
      __position._M_current =
           (this->producedValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->producedValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this,__position,&local_4c._M_value);
      }
      else {
        *__position._M_current = (int)local_4c;
        (this->producedValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      _Var3 = (_Optional_payload_base<int>)((ulong)period.__r / 1000);
      lVar4 = ((ulong)period.__r % 1000) * 1000000;
      if (0 < period.__r) {
        do {
          local_40 = lVar4;
          local_48 = (undefined1  [8])_Var3;
          iVar5 = nanosleep((timespec *)local_48,(timespec *)local_48);
          if (iVar5 != -1) break;
          piVar6 = __errno_location();
          _Var3 = (_Optional_payload_base<int>)local_48;
          lVar4 = local_40;
        } while (*piVar6 == 4);
      }
      _Var1._M_value = local_4c._M_value + 1;
      bVar2 = local_4c._M_value < noMessages;
      local_4c._M_value = _Var1._M_value;
    } while (bVar2);
  }
  local_48._0_5_ = 0x17fffffff;
  rtb::Concurrency::Queue<int>::push(local_38,(optional<int> *)local_48);
  return;
}

Assistant:

void Producer::operator()(Queue<int> &q, TimeT startTime, TimeT period, int noMessages) {
    auto start = std::chrono::system_clock::now();
    producedValues.reserve(200);
    std::this_thread::sleep_for(startTime);

    for (int i = 1; i <= noMessages; ++i) {
        q.push(i);
        producedValues.push_back(i);
        std::this_thread::sleep_for(period);
    }
    q.push(std::numeric_limits<int>::max());
}